

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<unsigned_int,_true>::push_back
          (SmallVectorTemplateBase<unsigned_int,_true> *this,uint *Elt)

{
  uint uVar1;
  
  uVar1 = (this->super_SmallVectorTemplateCommon<unsigned_int,_void>).super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<unsigned_int,_void>).super_SmallVectorBase.Capacity <=
      uVar1) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,4);
    uVar1 = (this->super_SmallVectorTemplateCommon<unsigned_int,_void>).super_SmallVectorBase.Size;
  }
  *(uint *)((long)(this->super_SmallVectorTemplateCommon<unsigned_int,_void>).super_SmallVectorBase.
                  BeginX + (ulong)uVar1 * 4) = *Elt;
  uVar1 = (this->super_SmallVectorTemplateCommon<unsigned_int,_void>).super_SmallVectorBase.Size;
  if (uVar1 < (this->super_SmallVectorTemplateCommon<unsigned_int,_void>).super_SmallVectorBase.
              Capacity) {
    (this->super_SmallVectorTemplateCommon<unsigned_int,_void>).super_SmallVectorBase.Size =
         uVar1 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }